

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool __thiscall
picojson::default_parse_context::
parse_object_item<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (default_parse_context *this,
          input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in,string *key)

{
  bool bVar1;
  mapped_type *out;
  default_parse_context local_30;
  default_parse_context ctx;
  object *o;
  string *key_local;
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_local;
  default_parse_context *this_local;
  
  ctx.out_ = (value *)value::
                      get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                                (this->out_);
  out = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                      *)ctx.out_,key);
  default_parse_context(&local_30,out);
  bVar1 = _parse<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (&local_30,in);
  return bVar1;
}

Assistant:

bool parse_object_item(input<Iter> &in, const std::string &key) {
    object &o = out_->get<object>();
    default_parse_context ctx(&o[key]);
    return _parse(ctx, in);
  }